

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

void VP8LConvertFromBGRA(uint32_t *in_data,int num_pixels,WEBP_CSP_MODE out_colorspace,uint8_t *rgba
                        )

{
  uint *puVar1;
  uint uVar2;
  VP8LConvertFunc UNRECOVERED_JUMPTABLE;
  uint *puVar3;
  int iVar4;
  
  switch(out_colorspace) {
  case MODE_RGB:
    UNRECOVERED_JUMPTABLE = VP8LConvertBGRAToRGB;
    break;
  case MODE_RGBA:
    UNRECOVERED_JUMPTABLE = VP8LConvertBGRAToRGBA;
    break;
  case MODE_BGR:
    UNRECOVERED_JUMPTABLE = VP8LConvertBGRAToBGR;
    break;
  case MODE_BGRA:
    memcpy(rgba,in_data,(long)num_pixels << 2);
    return;
  case MODE_ARGB:
    if (num_pixels < 1) {
      return;
    }
    puVar1 = in_data + num_pixels;
    do {
      uVar2 = *in_data;
      in_data = in_data + 1;
      *(uint *)rgba =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      rgba = (uint8_t *)((long)rgba + 4);
    } while (in_data < puVar1);
    return;
  case MODE_RGBA_4444:
    UNRECOVERED_JUMPTABLE = VP8LConvertBGRAToRGBA4444;
    break;
  case MODE_RGB_565:
    UNRECOVERED_JUMPTABLE = VP8LConvertBGRAToRGB565;
    break;
  case MODE_rgbA:
    (*VP8LConvertBGRAToRGBA)(in_data,num_pixels,rgba);
    goto LAB_0011408b;
  case MODE_bgrA:
    memcpy(rgba,in_data,(long)num_pixels << 2);
LAB_0011408b:
    iVar4 = 0;
LAB_0011409a:
    (*WebPApplyAlphaMultiply)(rgba,iVar4,num_pixels,1,0);
    return;
  case MODE_Argb:
    if (0 < num_pixels) {
      puVar1 = in_data + num_pixels;
      puVar3 = (uint *)rgba;
      do {
        uVar2 = *in_data;
        in_data = in_data + 1;
        *puVar3 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        puVar3 = puVar3 + 1;
      } while (in_data < puVar1);
    }
    iVar4 = 1;
    goto LAB_0011409a;
  case MODE_rgbA_4444:
    (*VP8LConvertBGRAToRGBA4444)(in_data,num_pixels,rgba);
    (*WebPApplyAlphaMultiply4444)(rgba,num_pixels,1,0);
    return;
  default:
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(in_data,num_pixels,rgba);
  return;
}

Assistant:

void VP8LConvertFromBGRA(const uint32_t* const in_data, int num_pixels,
                         WEBP_CSP_MODE out_colorspace, uint8_t* const rgba) {
  switch (out_colorspace) {
    case MODE_RGB:
      VP8LConvertBGRAToRGB(in_data, num_pixels, rgba);
      break;
    case MODE_RGBA:
      VP8LConvertBGRAToRGBA(in_data, num_pixels, rgba);
      break;
    case MODE_rgbA:
      VP8LConvertBGRAToRGBA(in_data, num_pixels, rgba);
      WebPApplyAlphaMultiply(rgba, 0, num_pixels, 1, 0);
      break;
    case MODE_BGR:
      VP8LConvertBGRAToBGR(in_data, num_pixels, rgba);
      break;
    case MODE_BGRA:
      CopyOrSwap(in_data, num_pixels, rgba, 1);
      break;
    case MODE_bgrA:
      CopyOrSwap(in_data, num_pixels, rgba, 1);
      WebPApplyAlphaMultiply(rgba, 0, num_pixels, 1, 0);
      break;
    case MODE_ARGB:
      CopyOrSwap(in_data, num_pixels, rgba, 0);
      break;
    case MODE_Argb:
      CopyOrSwap(in_data, num_pixels, rgba, 0);
      WebPApplyAlphaMultiply(rgba, 1, num_pixels, 1, 0);
      break;
    case MODE_RGBA_4444:
      VP8LConvertBGRAToRGBA4444(in_data, num_pixels, rgba);
      break;
    case MODE_rgbA_4444:
      VP8LConvertBGRAToRGBA4444(in_data, num_pixels, rgba);
      WebPApplyAlphaMultiply4444(rgba, num_pixels, 1, 0);
      break;
    case MODE_RGB_565:
      VP8LConvertBGRAToRGB565(in_data, num_pixels, rgba);
      break;
    default:
      assert(0);          // Code flow should not reach here.
  }
}